

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupCompositeTestOutput::~TEST_GROUP_CppUTestGroupCompositeTestOutput
          (TEST_GROUP_CppUTestGroupCompositeTestOutput *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCompositeTestOutput_00375778;
  CompositeTestOutput::~CompositeTestOutput(&this->compositeOutput);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_GROUP(CompositeTestOutput)
{
  CompositeTestOutputTestStringBufferTestOutput* output1;
  CompositeTestOutputTestStringBufferTestOutput* output2;
  CompositeTestOutput compositeOutput;
  TestResult* result;
  UtestShell* test;

  void setup() _override
  {
    output1 = new CompositeTestOutputTestStringBufferTestOutput;
    output2 = new CompositeTestOutputTestStringBufferTestOutput;
    compositeOutput.setOutputOne(output1);
    compositeOutput.setOutputTwo(output2);
    result = new TestResult(compositeOutput);
    test = new UtestShell("Group", "Name", "file", 10);
  }

  void teardown() _override
  {
    delete test;
    delete result;
  }
}